

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O1

void heap_down(uchar *a,size_t i,size_t heap_size,size_t stride,
              _func_int_void_ptr_void_ptr_void_ptr *cmp,void *cmp_data)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  uint64_t uVar174;
  uint64_t uVar175;
  int iVar176;
  uint uVar177;
  uint uVar178;
  ulong uVar179;
  secp256k1_context *z;
  uint uVar180;
  undefined4 *extraout_RDX;
  secp256k1_scalar *extraout_RDX_00;
  secp256k1_scalar *extraout_RDX_01;
  secp256k1_scalar *a_00;
  secp256k1_scalar *a_01;
  secp256k1_scalar *extraout_RDX_02;
  secp256k1_scalar *extraout_RDX_03;
  secp256k1_scalar *psVar181;
  secp256k1_scalar *extraout_RDX_04;
  secp256k1_scalar *a_02;
  ulong extraout_RDX_05;
  secp256k1_ge *a_03;
  uchar *unaff_RBX;
  secp256k1_context *psVar182;
  secp256k1_context *psVar183;
  long lVar184;
  secp256k1_context *psVar185;
  secp256k1_context *r;
  ulong uVar186;
  ulong uVar187;
  ulong unaff_RBP;
  undefined4 *puVar188;
  long lVar189;
  undefined8 *puVar190;
  secp256k1_context *a_04;
  _func_void_char_ptr_void_ptr *p_Var191;
  secp256k1_context *psVar192;
  secp256k1_fe *psVar193;
  undefined8 *puVar194;
  uint64_t *puVar195;
  secp256k1_context *r_00;
  ulong uVar196;
  secp256k1_gej *psVar197;
  ulong uVar198;
  ulong uVar199;
  ulong uVar200;
  uint uVar201;
  int *piVar202;
  byte bVar203;
  undefined1 auStack_7f8 [104];
  ulong uStack_790;
  ulong uStack_788;
  ulong uStack_780;
  ulong uStack_778;
  ulong uStack_770;
  undefined1 auStack_768 [56];
  uint64_t uStack_730;
  uint64_t uStack_728;
  uint64_t uStack_720;
  uint64_t uStack_718;
  int iStack_710;
  undefined1 auStack_708 [56];
  uint64_t uStack_6d0;
  _func_void_char_ptr_void_ptr *p_Stack_6c8;
  void *pvStack_6c0;
  _func_void_char_ptr_void_ptr *p_Stack_6b8;
  int iStack_6b0;
  undefined4 uStack_6ac;
  ulong uStack_6a8;
  ulong uStack_6a0;
  undefined1 auStack_698 [48];
  secp256k1_fe sStack_668;
  undefined1 auStack_638 [56];
  ulong uStack_600;
  _func_void_char_ptr_void_ptr *p_Stack_5f8;
  void *pvStack_5f0;
  _func_void_char_ptr_void_ptr *p_Stack_5e8;
  void *pvStack_5e0;
  secp256k1_context *psStack_5d0;
  secp256k1_gej *psStack_5c8;
  secp256k1_context *psStack_5c0;
  secp256k1_context *psStack_5b8;
  secp256k1_context *psStack_5b0;
  code *pcStack_5a8;
  secp256k1_context *psStack_598;
  secp256k1_context *psStack_590;
  secp256k1_context *psStack_588;
  secp256k1_context *psStack_580;
  code *pcStack_578;
  secp256k1_context *psStack_568;
  secp256k1_context *psStack_560;
  secp256k1_context *psStack_558;
  undefined4 *puStack_550;
  secp256k1_context *psStack_548;
  long lStack_540;
  long lStack_538;
  undefined1 auStack_530 [56];
  uint64_t uStack_4f8;
  uint64_t uStack_4f0;
  uint64_t uStack_4e8;
  uint64_t uStack_4e0;
  uint64_t uStack_4d8;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined1 auStack_4c0 [24];
  undefined1 auStack_4a8 [16];
  uint64_t uStack_498;
  secp256k1_scalar asStack_490 [132];
  secp256k1_context asStack_280 [2];
  uchar *puStack_78;
  ulong uStack_70;
  ulong uStack_68;
  size_t sStack_60;
  uchar *puStack_58;
  code *pcStack_50;
  undefined8 *local_40;
  ulong local_38;
  
  bVar203 = 0;
  local_38 = heap_size >> 1;
  psVar192 = (secp256k1_context *)a;
  uVar187 = i;
  local_40 = (undefined8 *)stride;
  if (i < local_38) {
    do {
      uVar198 = uVar187 * 2 + 1;
      if (heap_size <= uVar198) {
        pcStack_50 = secp256k1_ecmult_strauss_wnaf;
        heap_down_cold_1();
        auStack_4c0._0_8_ = 1;
        auStack_4c0._8_16_ = (undefined1  [16])0x0;
        auStack_4a8 = (undefined1  [16])0x0;
        uStack_498 = 0x100000001;
        pcStack_578 = (code *)0x120c69;
        z = (secp256k1_context *)stride;
        psVar197 = (secp256k1_gej *)cmp;
        puStack_550 = (undefined4 *)cmp_data;
        psStack_548 = (secp256k1_context *)i;
        puStack_78 = unaff_RBX;
        uStack_70 = uVar187;
        uStack_68 = uVar198;
        sStack_60 = heap_size;
        puStack_58 = a;
        pcStack_50 = (code *)unaff_RBP;
        secp256k1_fe_verify((secp256k1_fe *)auStack_4c0);
        psVar181 = extraout_RDX_00;
        if (extraout_RDX != (undefined4 *)0x0) {
          psVar182 = (secp256k1_context *)0x0;
          psStack_568 = (secp256k1_context *)0x0;
          puVar188 = extraout_RDX;
          goto LAB_00120c85;
        }
        psStack_568 = (secp256k1_context *)0x0;
        psVar182 = (secp256k1_context *)0x0;
        goto LAB_00120de4;
      }
      unaff_RBP = uVar187 * 2 + 2;
      if (unaff_RBP < heap_size) {
        pcStack_50 = (code *)0x120b9a;
        iVar176 = secp256k1_pubkey_cmp
                            ((secp256k1_context *)*local_40,
                             *(secp256k1_pubkey **)(a + unaff_RBP * 8),
                             *(secp256k1_pubkey **)(a + uVar198 * 8));
        if (iVar176 < 0) goto LAB_00120bc0;
        unaff_RBX = a + unaff_RBP * 8;
        psVar192 = (secp256k1_context *)*local_40;
        i = *(size_t *)unaff_RBX;
        pcStack_50 = (code *)0x120bb6;
        iVar176 = secp256k1_pubkey_cmp
                            (psVar192,(secp256k1_pubkey *)i,*(secp256k1_pubkey **)(a + uVar187 * 8))
        ;
        if (iVar176 < 1) {
          return;
        }
      }
      else {
LAB_00120bc0:
        psVar192 = (secp256k1_context *)*local_40;
        i = *(size_t *)(a + uVar198 * 8);
        pcStack_50 = (code *)0x120bd5;
        iVar176 = secp256k1_pubkey_cmp
                            (psVar192,(secp256k1_pubkey *)i,*(secp256k1_pubkey **)(a + uVar187 * 8))
        ;
        if (iVar176 < 1) {
          return;
        }
        unaff_RBX = a + uVar198 * 8;
        unaff_RBP = uVar198;
      }
      stride = *(size_t *)(a + uVar187 * 8);
      *(undefined8 *)(a + uVar187 * 8) = *(undefined8 *)unaff_RBX;
      *(size_t *)unaff_RBX = stride;
      uVar187 = unaff_RBP;
    } while (unaff_RBP < local_38);
  }
  return;
LAB_00120c85:
  psVar185 = asStack_280;
  if ((int)(((secp256k1_gej *)cmp)->x).n[0] != 0) {
    pcStack_578 = (code *)0x120c98;
    secp256k1_gej_verify((secp256k1_gej *)stride);
    iVar176 = (int)z;
    psVar181 = extraout_RDX_01;
    if ((((secp256k1_context *)stride)->ecmult_gen_ctx).initial.z.magnitude == 0) {
      pcStack_578 = (code *)0x120cbb;
      secp256k1_scalar_split_lambda
                (asStack_490,(secp256k1_scalar *)auStack_530,(secp256k1_scalar *)cmp);
      psVar183 = (secp256k1_context *)((long)psVar182 * 0x410);
      pcStack_578 = (code *)0x120cdb;
      psStack_560 = psVar182;
      iVar176 = secp256k1_ecmult_wnaf
                          ((int *)((long)(psVar183->ecmult_gen_ctx).initial.x.n +
                                  ((psVar192->ecmult_gen_ctx).initial.x.n[1] - 8)),(int)asStack_490,
                           a_00,iVar176);
      uVar1 = (psVar192->ecmult_gen_ctx).initial.x.n[1];
      r = (secp256k1_context *)((long)psVar183[2].ecmult_gen_ctx.initial.z.n + uVar1 + 0xc);
      *(int *)((long)psVar183[5].ecmult_gen_ctx.initial.x.n + uVar1 + 0x18) = iVar176;
      psVar182 = (secp256k1_context *)auStack_530;
      pcStack_578 = (code *)0x120cfa;
      uVar177 = secp256k1_ecmult_wnaf((int *)r,(int)psVar182,a_01,(int)uVar1);
      uVar1 = (psVar192->ecmult_gen_ctx).initial.x.n[1];
      *(uint *)((long)psVar183[5].ecmult_gen_ctx.initial.x.n + uVar1 + 0x1c) = uVar177;
      uVar180 = *(uint *)((long)psVar183[5].ecmult_gen_ctx.initial.x.n + uVar1 + 0x18);
      z = (secp256k1_context *)(ulong)uVar180;
      if (0x81 < (int)uVar180) goto LAB_001212bc;
      if (0x81 < *(int *)((long)psVar183[5].ecmult_gen_ctx.initial.x.n + uVar1 + 0x1c))
      goto LAB_001212c1;
      if ((int)uVar180 <= (int)psStack_568) {
        z = (secp256k1_context *)((ulong)psStack_568 & 0xffffffff);
      }
      if ((int)z < (int)uVar177) {
        z = (secp256k1_context *)(ulong)uVar177;
      }
      pcStack_578 = (code *)0x120d50;
      psStack_568 = z;
      memcpy(psVar185,(void *)stride,0x98);
      psVar182 = psStack_560;
      if (psStack_560 != (secp256k1_context *)0x0) {
        pcStack_578 = (code *)0x120d70;
        secp256k1_gej_rescale((secp256k1_gej *)psVar185,(secp256k1_fe *)auStack_4c0);
      }
      z = asStack_280;
      pcStack_578 = (code *)0x120d9c;
      secp256k1_ecmult_odd_multiples_table
                ((int)psVar182 * 0x1a0 + (int)(psVar192->ecmult_gen_ctx).initial.x.n[0],
                 (secp256k1_ge *)((long)psVar182 * 0xc0 + *(uint64_t *)&psVar192->ecmult_gen_ctx),
                 (secp256k1_fe *)auStack_4c0,(secp256k1_fe *)z,psVar197);
      psVar181 = extraout_RDX_02;
      if (psVar182 != (secp256k1_context *)0x0) {
        psVar193 = (secp256k1_fe *)((long)psVar182 * 0xc0 + *(uint64_t *)&psVar192->ecmult_gen_ctx);
        pcStack_578 = (code *)0x120dc0;
        secp256k1_fe_mul(psVar193,psVar193,
                         (secp256k1_fe *)
                         &(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.y.magnitude);
        psVar181 = extraout_RDX_03;
      }
      psVar182 = (secp256k1_context *)((long)&(psVar182->ecmult_gen_ctx).built + 1);
    }
  }
  stride = (size_t)&(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.infinity;
  cmp = (_func_int_void_ptr_void_ptr_void_ptr *)((long)(((secp256k1_gej *)cmp)->x).n + 4);
  puVar188 = (undefined4 *)((long)puVar188 + -1);
  if (puVar188 == (undefined4 *)0x0) {
LAB_00120de4:
    psStack_560 = psVar182;
    if (psVar182 != (secp256k1_context *)0x0) {
      pcStack_578 = (code *)0x120e07;
      secp256k1_ge_table_set_globalz
                ((long)psVar182 * 4,(secp256k1_ge *)(psVar192->ecmult_gen_ctx).initial.x.n[0],
                 *(secp256k1_fe **)&psVar192->ecmult_gen_ctx);
      lVar184 = 0;
      psVar182 = (secp256k1_context *)0x0;
      psVar185 = (secp256k1_context *)0x0;
      do {
        lVar189 = 0;
        psStack_558 = psVar182;
        do {
          pcStack_578 = (code *)0x120e35;
          secp256k1_fe_mul((secp256k1_fe *)
                           (*(uint64_t *)&psVar192->ecmult_gen_ctx + lVar184 + lVar189),
                           (secp256k1_fe *)
                           ((long)(psVar182->ecmult_gen_ctx).initial.x.n +
                           ((psVar192->ecmult_gen_ctx).initial.x.n[0] - 8)),&secp256k1_const_beta);
          psVar182 = (secp256k1_context *)&(psVar182->ecmult_gen_ctx).initial.z;
          lVar189 = lVar189 + 0x30;
        } while (lVar189 != 0xc0);
        psVar185 = (secp256k1_context *)((long)&(psVar185->ecmult_gen_ctx).built + 1);
        psVar182 = (secp256k1_context *)(psStack_558[2].ecmult_gen_ctx.initial.x.n + 1);
        lVar184 = lVar184 + 0xc0;
        psVar181 = extraout_RDX_04;
      } while (psVar185 != psStack_560);
    }
    if (puStack_550 == (undefined4 *)0x0) {
      lStack_538 = 0;
      lStack_540 = 0;
      uVar180 = (uint)psStack_568;
    }
    else {
      uStack_4c4 = *puStack_550;
      uStack_4c8 = 0;
      pcStack_578 = (code *)0x120e95;
      uVar177 = secp256k1_ecmult_wnaf((int *)asStack_280,(int)&uStack_4c4,psVar181,(int)z);
      pcStack_578 = (code *)0x120ea7;
      uVar178 = secp256k1_ecmult_wnaf((int *)asStack_490,(int)&uStack_4c8,a_02,(int)z);
      uVar180 = (uint)psStack_568;
      if ((int)(uint)psStack_568 < (int)uVar177) {
        uVar180 = uVar177;
      }
      if ((int)uVar180 < (int)uVar178) {
        uVar180 = uVar178;
      }
      lStack_540 = (long)(int)uVar178;
      lStack_538 = (long)(int)uVar177;
    }
    r = psStack_548;
    pcStack_578 = (code *)0x120eeb;
    secp256k1_gej_set_infinity((secp256k1_gej *)psStack_548);
    if (0 < (int)uVar180) {
      psVar185 = (secp256k1_context *)(ulong)uVar180;
      puStack_550 = (undefined4 *)((long)psVar185 * 4 + -4);
      psStack_568 = psVar192;
      do {
        pcStack_578 = (code *)0x120f14;
        secp256k1_gej_double_var((secp256k1_gej *)r,(secp256k1_gej *)r,(secp256k1_fe *)0x0);
        psVar182 = psVar185;
        psStack_558 = psVar185;
        if (psStack_560 != (secp256k1_context *)0x0) {
          cmp = (_func_int_void_ptr_void_ptr_void_ptr *)0x40c;
          stride = 0x30;
          psVar183 = (secp256k1_context *)0x0;
          puVar188 = puStack_550;
          psVar185 = psStack_560;
          do {
            uVar1 = (psVar192->ecmult_gen_ctx).initial.x.n[1];
            z = (secp256k1_context *)
                (long)*(int *)((long)(((secp256k1_gej *)cmp)->x).n + (uVar1 - 4));
            if (((long)psVar182 <= (long)z) &&
               (uVar180 = *(uint *)(uVar1 + (long)puVar188), uVar180 != 0)) {
              if ((uVar180 & 1) == 0) {
                pcStack_578 = (code *)0x121299;
                secp256k1_ecmult_strauss_wnaf_cold_6();
LAB_00121299:
                pcStack_578 = (code *)0x12129e;
                secp256k1_ecmult_strauss_wnaf_cold_5();
LAB_0012129e:
                pcStack_578 = (code *)0x1212a3;
                secp256k1_ecmult_strauss_wnaf_cold_10();
LAB_001212a3:
                pcStack_578 = (code *)0x1212a8;
                secp256k1_ecmult_strauss_wnaf_cold_4();
LAB_001212a8:
                pcStack_578 = (code *)0x1212ad;
                secp256k1_ecmult_strauss_wnaf_cold_9();
LAB_001212ad:
                pcStack_578 = (code *)0x1212b2;
                secp256k1_ecmult_strauss_wnaf_cold_8();
              }
              else {
                if ((int)uVar180 < -7) goto LAB_00121299;
                if (7 < (int)uVar180) goto LAB_001212a3;
                uVar1 = (psVar192->ecmult_gen_ctx).initial.x.n[0];
                if (0 < (int)uVar180) {
                  puVar190 = (undefined8 *)
                             ((long)&(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.x +
                             uVar1 + (ulong)(uVar180 - 1 >> 1) * 0x68 + -0x38);
                  puVar194 = (undefined8 *)auStack_530;
                  for (lVar184 = 0xd; lVar184 != 0; lVar184 = lVar184 + -1) {
                    *puVar194 = *puVar190;
                    puVar190 = puVar190 + (ulong)bVar203 * -2 + 1;
                    puVar194 = puVar194 + (ulong)bVar203 * -2 + 1;
                  }
LAB_0012104a:
                  pcStack_578 = (code *)0x12105c;
                  r = psStack_548;
                  secp256k1_gej_add_ge_var
                            ((secp256k1_gej *)psStack_548,(secp256k1_gej *)psStack_548,
                             (secp256k1_ge *)auStack_530,(secp256k1_fe *)0x0);
                  psVar182 = psStack_558;
                  goto LAB_00121061;
                }
                psVar182 = (secp256k1_context *)
                           ((long)&(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.x +
                           uVar1 + (ulong)(~uVar180 >> 1) * 0x68 + -0x38);
                puVar195 = (uint64_t *)auStack_530;
                for (z = (secp256k1_context *)0xd; z != (secp256k1_context *)0x0;
                    z = (secp256k1_context *)&z[-1].field_0xc7) {
                  *puVar195 = *(uint64_t *)&psVar182->ecmult_gen_ctx;
                  psVar182 = (secp256k1_context *)((long)psVar182 + (ulong)bVar203 * -0x10 + 8);
                  puVar195 = puVar195 + (ulong)bVar203 * -2 + 1;
                }
                r = (secp256k1_context *)(auStack_530 + 0x30);
                pcStack_578 = (code *)0x120fd1;
                secp256k1_fe_verify((secp256k1_fe *)r);
                if ((int)uStack_4d8 < 2) {
                  auStack_530._48_8_ = 0x3ffffbfffff0bc - auStack_530._48_8_;
                  uStack_4f8 = 0x3ffffffffffffc - uStack_4f8;
                  uStack_4f0 = 0x3ffffffffffffc - uStack_4f0;
                  uStack_4e8 = 0x3ffffffffffffc - uStack_4e8;
                  uStack_4e0 = 0x3fffffffffffc - uStack_4e0;
                  uStack_4d8 = 2;
                  pcStack_578 = (code *)0x121045;
                  secp256k1_fe_verify((secp256k1_fe *)(auStack_530 + 0x30));
                  goto LAB_0012104a;
                }
              }
              pcStack_578 = (code *)0x1212b7;
              secp256k1_ecmult_strauss_wnaf_cold_3();
LAB_001212b7:
              pcStack_578 = (code *)0x1212bc;
              secp256k1_ecmult_strauss_wnaf_cold_7();
              goto LAB_001212bc;
            }
LAB_00121061:
            uVar1 = (psVar192->ecmult_gen_ctx).initial.x.n[1];
            z = (secp256k1_context *)(long)*(int *)((long)(((secp256k1_gej *)cmp)->x).n + uVar1);
            if (((long)psVar182 <= (long)z) &&
               (uVar180 = *(uint *)(uVar1 + 0x204 + (long)puVar188), uVar180 != 0)) {
              if ((uVar180 & 1) == 0) goto LAB_0012129e;
              if ((int)uVar180 < -7) goto LAB_001212a8;
              if (7 < (int)uVar180) goto LAB_001212ad;
              uVar1 = (psVar192->ecmult_gen_ctx).initial.x.n[0];
              if (0 < (int)uVar180) {
                uVar187 = (ulong)(uVar180 - 1 >> 1);
                pcStack_578 = (code *)0x1210cf;
                secp256k1_ge_set_xy((secp256k1_ge *)auStack_530,
                                    (secp256k1_fe *)
                                    ((long)(&(psVar183->ecmult_gen_ctx).initial.x)[uVar187].n +
                                    (*(uint64_t *)&psVar192->ecmult_gen_ctx - 8)),
                                    (secp256k1_fe *)
                                    ((long)&(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.
                                            x + uVar187 * 0x68 + uVar1 + -8));
LAB_0012117e:
                z = (secp256k1_context *)0x0;
                pcStack_578 = (code *)0x121190;
                r = psStack_548;
                secp256k1_gej_add_ge_var
                          ((secp256k1_gej *)psStack_548,(secp256k1_gej *)psStack_548,
                           (secp256k1_ge *)auStack_530,(secp256k1_fe *)0x0);
                psVar182 = psStack_558;
                psVar192 = psStack_568;
                goto LAB_0012119a;
              }
              z = (secp256k1_context *)((ulong)(~uVar180 >> 1) * 0x30);
              psVar182 = (secp256k1_context *)
                         ((undefined1 *)
                          ((long)(psVar183->ecmult_gen_ctx).initial.x.n +
                          (*(uint64_t *)&psVar192->ecmult_gen_ctx - 0x10)) +
                         (long)&(z->ecmult_gen_ctx).initial.x);
              pcStack_578 = (code *)0x1210fa;
              secp256k1_ge_set_xy((secp256k1_ge *)auStack_530,(secp256k1_fe *)psVar182,
                                  (secp256k1_fe *)
                                  ((long)&(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.x
                                  + (ulong)(~uVar180 >> 1) * 0x68 + uVar1 + -8));
              psVar192 = (secp256k1_context *)(auStack_530 + 0x30);
              pcStack_578 = (code *)0x121107;
              r = psVar192;
              secp256k1_fe_verify((secp256k1_fe *)psVar192);
              if ((int)uStack_4d8 < 2) {
                auStack_530._48_8_ = 0x3ffffbfffff0bc - auStack_530._48_8_;
                uStack_4f8 = 0x3ffffffffffffc - uStack_4f8;
                uStack_4f0 = 0x3ffffffffffffc - uStack_4f0;
                uStack_4e8 = 0x3ffffffffffffc - uStack_4e8;
                uStack_4e0 = 0x3fffffffffffc - uStack_4e0;
                uStack_4d8 = 2;
                pcStack_578 = (code *)0x121179;
                secp256k1_fe_verify((secp256k1_fe *)psVar192);
                goto LAB_0012117e;
              }
              goto LAB_001212b7;
            }
LAB_0012119a:
            puVar188 = puVar188 + 0x104;
            cmp = (_func_int_void_ptr_void_ptr_void_ptr *)
                  ((((secp256k1_gej *)((long)cmp + 0x390))->z).n + 4);
            stride = (size_t)((((secp256k1_context *)(stride + 400))->ecmult_gen_ctx).initial.x.n +
                             1);
            psVar183 = (secp256k1_context *)&psVar183->declassify;
            psVar185 = (secp256k1_context *)&psVar185[-1].field_0xc7;
          } while (psVar185 != (secp256k1_context *)0x0);
        }
        r = psStack_548;
        psVar185 = (secp256k1_context *)&psVar182[-1].field_0xc7;
        if (((long)psVar182 <= lStack_538) &&
           (iVar176 = *(int *)((long)asStack_280[0].ecmult_gen_ctx.initial.x.n +
                              (long)psVar185 * 4 + -8), iVar176 != 0)) {
          pcStack_578 = (code *)0x1211eb;
          secp256k1_ecmult_table_get_ge_storage
                    ((secp256k1_ge *)auStack_530,secp256k1_pre_g,iVar176,(int)z);
          psVar192 = psStack_568;
          z = (secp256k1_context *)auStack_4c0;
          pcStack_578 = (code *)0x121206;
          secp256k1_gej_add_zinv_var
                    ((secp256k1_gej *)r,(secp256k1_gej *)r,(secp256k1_ge *)auStack_530,
                     (secp256k1_fe *)z);
          psVar182 = psStack_558;
        }
        if (((long)psVar182 <= lStack_540) && (asStack_490[(long)psVar185] != 0)) {
          pcStack_578 = (code *)0x121231;
          secp256k1_ecmult_table_get_ge_storage
                    ((secp256k1_ge *)auStack_530,secp256k1_pre_g_128,asStack_490[(long)psVar185],
                     (int)z);
          psVar192 = psStack_568;
          z = (secp256k1_context *)auStack_4c0;
          pcStack_578 = (code *)0x12124c;
          secp256k1_gej_add_zinv_var
                    ((secp256k1_gej *)r,(secp256k1_gej *)r,(secp256k1_ge *)auStack_530,
                     (secp256k1_fe *)z);
          psVar182 = psStack_558;
        }
        puStack_550 = puStack_550 + -1;
      } while (1 < (long)psVar182);
    }
    if ((r->ecmult_gen_ctx).initial.z.magnitude == 0) {
      piVar202 = &(r->ecmult_gen_ctx).initial.y.magnitude;
      pcStack_578 = (code *)0x121282;
      secp256k1_fe_mul((secp256k1_fe *)piVar202,(secp256k1_fe *)piVar202,(secp256k1_fe *)auStack_4c0
                      );
    }
    return;
  }
  goto LAB_00120c85;
LAB_001212bc:
  pcStack_578 = (code *)0x1212c1;
  secp256k1_ecmult_strauss_wnaf_cold_2();
LAB_001212c1:
  pcStack_578 = secp256k1_ecmult_wnaf;
  secp256k1_ecmult_strauss_wnaf_cold_1();
  a_04 = psVar182;
  r_00 = r;
  psStack_588 = psVar183;
  psStack_580 = psVar192;
  pcStack_578 = (code *)puVar188;
  if (r == (secp256k1_context *)0x0) {
LAB_001213ae:
    psVar182 = psVar192;
    psStack_590 = (secp256k1_context *)0x1213b3;
    secp256k1_ecmult_wnaf_cold_4();
LAB_001213b3:
    r = psVar183;
    psStack_590 = (secp256k1_context *)0x1213b8;
    secp256k1_ecmult_wnaf_cold_3();
  }
  else {
    if (psVar182 == (secp256k1_context *)0x0) goto LAB_001213b3;
    puVar188 = (undefined4 *)0x0;
    psStack_590 = (secp256k1_context *)0x1212f0;
    memset(r,0,0x204);
    uVar180 = (uint)*(uint64_t *)&(psVar182->ecmult_gen_ctx).built;
    r_00 = (secp256k1_context *)(ulong)uVar180;
    uVar177 = 0;
    a_04 = (secp256k1_context *)0x0;
    do {
      z = a_04;
      uVar178 = (uint)z;
      bVar203 = (byte)z;
      if (((uint)(uVar178 < 0x20) & uVar180 >> (bVar203 & 0x1f)) == uVar177) {
        uVar178 = uVar178 + 1;
      }
      else {
        z = (secp256k1_context *)(ulong)(0x81 - uVar178);
        if ((int)uVar178 < 0x7e) {
          z = (secp256k1_context *)0x4;
        }
        uVar201 = ~(-1 << ((byte)z & 0x1f)) & uVar180 >> (bVar203 & 0x1f);
        if (0x1f < uVar178) {
          uVar201 = 0;
        }
        uVar201 = uVar201 + uVar177;
        uVar177 = uVar201 >> 3 & 1;
        *(uint *)((long)(r->ecmult_gen_ctx).initial.x.n + (long)(int)uVar178 * 4 + -8) =
             uVar201 + uVar177 * -0x10;
        uVar178 = (int)z + uVar178;
      }
      a_04 = (secp256k1_context *)(ulong)uVar178;
    } while ((int)uVar178 < 0x81);
    if (uVar177 == 0) {
      z = a_04;
      if ((int)uVar178 < 0x100) {
        do {
          if (((uint)z < 0x20) &&
             (uVar177 = 1 << ((byte)z & 0x1f) & uVar180, a_04 = (secp256k1_context *)(ulong)uVar177,
             uVar177 != 0)) {
            psStack_590 = (secp256k1_context *)0x1213ae;
            secp256k1_ecmult_wnaf_cold_2();
            psVar183 = r;
            psVar192 = psVar182;
            goto LAB_001213ae;
          }
          uVar177 = (uint)z + 1;
          z = (secp256k1_context *)(ulong)uVar177;
        } while (uVar177 != 0x100);
      }
      return;
    }
  }
  psStack_590 = (secp256k1_context *)secp256k1_ecmult_table_get_ge_storage;
  secp256k1_ecmult_wnaf_cold_1();
  psStack_598 = r;
  psStack_590 = psVar182;
  if ((extraout_RDX_05 & 1) == 0) {
    pcStack_5a8 = (code *)0x12147c;
    secp256k1_ecmult_table_get_ge_storage_cold_4();
    psVar192 = r_00;
LAB_0012147c:
    pcStack_5a8 = (code *)0x121481;
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_00121481:
    pcStack_5a8 = (code *)0x121486;
    secp256k1_ecmult_table_get_ge_storage_cold_2();
  }
  else {
    uVar180 = (uint)extraout_RDX_05;
    psVar192 = r_00;
    if ((int)uVar180 < -7) goto LAB_0012147c;
    if (7 < (int)uVar180) goto LAB_00121481;
    if (0 < (int)uVar180) {
      secp256k1_ge_from_storage
                ((secp256k1_ge *)r_00,
                 (secp256k1_ge_storage *)
                 ((long)&(a_04->ecmult_gen_ctx).initial.x + (ulong)(uVar180 - 1 >> 1) * 0x40 + -8));
      return;
    }
    a_04 = (secp256k1_context *)
           ((long)&(a_04->ecmult_gen_ctx).initial.x + (ulong)(~uVar180 >> 1) * 0x40 + -8);
    pcStack_5a8 = (code *)0x121410;
    secp256k1_ge_from_storage((secp256k1_ge *)r_00,(secp256k1_ge_storage *)a_04);
    psVar182 = (secp256k1_context *)&(r_00->ecmult_gen_ctx).initial.x.magnitude;
    pcStack_5a8 = (code *)0x12141c;
    psVar192 = psVar182;
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    r = r_00;
    if ((int)(r_00->ecmult_gen_ctx).initial.y.n[4] < 2) {
      uVar1 = (r_00->ecmult_gen_ctx).initial.y.n[0];
      uVar174 = (r_00->ecmult_gen_ctx).initial.y.n[1];
      uVar175 = (r_00->ecmult_gen_ctx).initial.y.n[2];
      *(long *)&(r_00->ecmult_gen_ctx).initial.x.magnitude =
           0x3ffffbfffff0bc - *(long *)&(r_00->ecmult_gen_ctx).initial.x.magnitude;
      (r_00->ecmult_gen_ctx).initial.y.n[0] = 0x3ffffffffffffc - uVar1;
      (r_00->ecmult_gen_ctx).initial.y.n[1] = 0x3ffffffffffffc - uVar174;
      (r_00->ecmult_gen_ctx).initial.y.n[2] = 0x3ffffffffffffc - uVar175;
      (r_00->ecmult_gen_ctx).initial.y.n[3] =
           0x3fffffffffffc - (r_00->ecmult_gen_ctx).initial.y.n[3];
      (r_00->ecmult_gen_ctx).initial.y.n[4] = 2;
      secp256k1_fe_verify((secp256k1_fe *)psVar182);
      return;
    }
  }
  pcStack_5a8 = secp256k1_gej_add_zinv_var;
  secp256k1_ecmult_table_get_ge_storage_cold_1();
  psStack_5d0 = r;
  psStack_5c8 = (secp256k1_gej *)cmp;
  psStack_5c0 = (secp256k1_context *)stride;
  psStack_5b8 = psVar182;
  psStack_5b0 = psVar185;
  pcStack_5a8 = (code *)puVar188;
  secp256k1_ge_verify(a_03);
  secp256k1_fe_verify((secp256k1_fe *)z);
  if ((a_04->ecmult_gen_ctx).initial.z.magnitude == 0) {
    if (a_03->infinity != 0) {
      memcpy(psVar192,a_04,0x98);
      return;
    }
    piVar202 = &(a_04->ecmult_gen_ctx).initial.y.magnitude;
    psVar182 = (secp256k1_context *)auStack_638;
    secp256k1_fe_mul((secp256k1_fe *)psVar182,(secp256k1_fe *)piVar202,(secp256k1_fe *)z);
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    if (8 < (int)auStack_638._40_4_) goto LAB_001226f9;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = auStack_638._0_8_ * 2;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = auStack_638._24_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auStack_638._8_8_ * 2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = auStack_638._16_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auStack_638._32_8_;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = auStack_638._32_8_;
    uVar198 = SUB168(auVar24 * auVar100,0);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar198 & 0xfffffffffffff;
    auVar22 = auVar23 * auVar99 + auVar22 * auVar98 + auVar25 * ZEXT816(0x1000003d10);
    uVar187 = auVar22._0_8_;
    auStack_708._0_8_ = uVar187 & 0xfffffffffffff;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar187 >> 0x34 | auVar22._8_8_ << 0xc;
    uVar187 = auStack_638._32_8_ * 2;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auStack_638._0_8_;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar187;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auStack_638._8_8_ * 2;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = auStack_638._24_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = auStack_638._16_8_;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = auStack_638._16_8_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar198 >> 0x34 | SUB168(auVar24 * auVar100,8) << 0xc;
    auVar22 = auVar26 * auVar101 + auVar153 + auVar27 * auVar102 + auVar28 * auVar103 +
              auVar29 * ZEXT816(0x1000003d10);
    auStack_768._48_8_ = auVar22._0_8_;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = (ulong)auStack_768._48_8_ >> 0x34 | auVar22._8_8_ << 0xc;
    auStack_768._0_8_ = (auStack_768._48_8_ & 0xfffffffffffff) >> 0x30;
    auStack_768._48_8_ = auStack_768._48_8_ & 0xffffffffffff;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = auStack_638._0_8_;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = auStack_638._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auStack_638._8_8_;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar187;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = auStack_638._16_8_ * 2;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = auStack_638._24_8_;
    auVar22 = auVar31 * auVar105 + auVar154 + auVar32 * auVar106;
    uVar198 = auVar22._0_8_;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar198 >> 0x34 | auVar22._8_8_ << 0xc;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = (uVar198 & 0xfffffffffffff) << 4 | auStack_768._0_8_;
    auVar22 = auVar30 * auVar104 + ZEXT816(0x1000003d1) * auVar107;
    uVar198 = auVar22._0_8_;
    sStack_668.n[0] = uVar198 & 0xfffffffffffff;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar198 >> 0x34 | auVar22._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = auStack_638._0_8_ * 2;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = auStack_638._8_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auStack_638._16_8_;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar187;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = auStack_638._24_8_;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = auStack_638._24_8_;
    auVar23 = auVar34 * auVar109 + auVar156 + auVar35 * auVar110;
    uVar198 = auVar23._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar198 & 0xfffffffffffff;
    auVar22 = auVar33 * auVar108 + auVar155 + auVar36 * ZEXT816(0x1000003d10);
    uVar199 = auVar22._0_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar198 >> 0x34 | auVar23._8_8_ << 0xc;
    sStack_668.n[1] = uVar199 & 0xfffffffffffff;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar199 >> 0x34 | auVar22._8_8_ << 0xc;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = auStack_638._0_8_ * 2;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = auStack_638._16_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = auStack_638._8_8_;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = auStack_638._8_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = auStack_638._24_8_;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar187;
    auVar158 = auVar39 * auVar113 + auVar158;
    uVar187 = auVar158._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar187 & 0xfffffffffffff;
    auVar22 = auVar37 * auVar111 + auVar157 + auVar38 * auVar112 + auVar40 * ZEXT816(0x1000003d10);
    uVar198 = auVar22._0_8_;
    sStack_668.n[2] = uVar198 & 0xfffffffffffff;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = (uVar198 >> 0x34 | auVar22._8_8_ << 0xc) + auStack_708._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar187 >> 0x34 | auVar158._8_8_ << 0xc;
    auVar159 = auVar41 * ZEXT816(0x1000003d10) + auVar159;
    uVar187 = auVar159._0_8_;
    sStack_668.n[3] = uVar187 & 0xfffffffffffff;
    sStack_668.n[4] = (uVar187 >> 0x34 | auVar159._8_8_ << 0xc) + auStack_768._48_8_;
    sStack_668.magnitude = 1;
    sStack_668.normalized = 0;
    secp256k1_fe_verify(&sStack_668);
    auStack_708._0_4_ = (a_04->ecmult_gen_ctx).built;
    auStack_708._4_4_ = (a_04->ecmult_gen_ctx).blind;
    auStack_708._8_8_ = (a_04->ecmult_gen_ctx).initial.x.n[0];
    auStack_708._16_8_ = (a_04->ecmult_gen_ctx).initial.x.n[1];
    auStack_708._24_8_ = (a_04->ecmult_gen_ctx).initial.x.n[2];
    auStack_708._32_8_ = (a_04->ecmult_gen_ctx).initial.x.n[3];
    auStack_708._40_8_ = (a_04->ecmult_gen_ctx).initial.x.n[4];
    psVar182 = (secp256k1_context *)auStack_708;
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    uVar187 = ((ulong)auStack_708._32_8_ >> 0x30) * 0x1000003d1 + auStack_708._0_8_;
    uVar198 = (uVar187 >> 0x34) + auStack_708._8_8_;
    uVar199 = auStack_708._16_8_ + (uVar198 >> 0x34);
    uVar196 = (uVar199 >> 0x34) + auStack_708._24_8_;
    auStack_708._24_8_ = uVar196 & 0xfffffffffffff;
    auStack_708._32_8_ = (uVar196 >> 0x34) + (auStack_708._32_8_ & 0xffffffffffff);
    auStack_708._16_8_ = uVar199 & 0xfffffffffffff;
    auStack_708._8_8_ = uVar198 & 0xfffffffffffff;
    auStack_708._0_8_ = uVar187 & 0xfffffffffffff;
    auStack_708._40_4_ = 1;
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_768 + 0x30),&a_03->x,&sStack_668);
    auStack_768._0_4_ = (a_04->ecmult_gen_ctx).initial.x.magnitude;
    auStack_768._4_4_ = (a_04->ecmult_gen_ctx).initial.x.normalized;
    auStack_768._8_8_ = (a_04->ecmult_gen_ctx).initial.y.n[0];
    auStack_768._16_8_ = (a_04->ecmult_gen_ctx).initial.y.n[1];
    auStack_768._24_8_ = (a_04->ecmult_gen_ctx).initial.y.n[2];
    auStack_768._32_8_ = (a_04->ecmult_gen_ctx).initial.y.n[3];
    auStack_768._40_8_ = (a_04->ecmult_gen_ctx).initial.y.n[4];
    secp256k1_fe_verify((secp256k1_fe *)auStack_768);
    uVar187 = ((ulong)auStack_768._32_8_ >> 0x30) * 0x1000003d1 + auStack_768._0_8_;
    uVar198 = (uVar187 >> 0x34) + auStack_768._8_8_;
    uVar199 = (auStack_768._16_8_ + (uVar198 >> 0x34) >> 0x34) + auStack_768._24_8_;
    auStack_768._24_8_ = uVar199 & 0xfffffffffffff;
    auStack_768._32_8_ = (uVar199 >> 0x34) + (auStack_768._32_8_ & 0xffffffffffff);
    auStack_768._16_8_ = (ulong)(auStack_768._16_8_ + (uVar198 >> 0x34)) & 0xfffffffffffff;
    auStack_768._8_8_ = uVar198 & 0xfffffffffffff;
    auStack_768._0_8_ = uVar187 & 0xfffffffffffff;
    auStack_768._40_4_ = 1;
    secp256k1_fe_verify((secp256k1_fe *)auStack_768);
    secp256k1_fe_mul((secp256k1_fe *)auStack_698,&a_03->y,&sStack_668);
    secp256k1_fe_mul((secp256k1_fe *)auStack_698,(secp256k1_fe *)auStack_698,
                     (secp256k1_fe *)auStack_638);
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    if (1 < (int)auStack_708._40_4_) goto LAB_001226fe;
    auStack_7f8._96_8_ = 0x3ffffbfffff0bc - auStack_708._0_8_;
    uStack_790 = 0x3ffffffffffffc - auStack_708._8_8_;
    uStack_788 = 0x3ffffffffffffc - auStack_708._16_8_;
    uStack_780 = 0x3ffffffffffffc - auStack_708._24_8_;
    uStack_778 = 0x3fffffffffffc - auStack_708._32_8_;
    uStack_770 = 2;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7f8 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7f8 + 0x60));
    psVar182 = (secp256k1_context *)(auStack_768 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    if (0x20 < iStack_710 + (int)uStack_770) goto LAB_00122703;
    auStack_7f8._96_8_ = auStack_7f8._96_8_ + auStack_768._48_8_;
    uStack_790 = uStack_790 + uStack_730;
    uStack_788 = uStack_788 + uStack_728;
    uStack_780 = uStack_780 + uStack_720;
    uStack_778 = uStack_778 + uStack_718;
    uStack_770 = (ulong)(uint)(iStack_710 + (int)uStack_770);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7f8 + 0x60));
    psVar182 = (secp256k1_context *)auStack_698;
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    if (1 < (int)auStack_698._40_4_) goto LAB_00122708;
    auStack_7f8._48_8_ = 0x3ffffbfffff0bc - auStack_698._0_8_;
    auStack_7f8._56_8_ = 0x3ffffffffffffc - auStack_698._8_8_;
    auStack_7f8._64_8_ = 0x3ffffffffffffc - auStack_698._16_8_;
    auStack_7f8._72_8_ = 0x3ffffffffffffc - auStack_698._24_8_;
    auStack_7f8._80_8_ = 0x3fffffffffffc - auStack_698._32_8_;
    auStack_7f8._88_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7f8 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7f8 + 0x30));
    psVar182 = (secp256k1_context *)auStack_768;
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    if (0x20 < (int)(auStack_768._40_4_ + auStack_7f8._88_4_)) goto LAB_0012270d;
    auStack_7f8._48_8_ = auStack_7f8._48_8_ + auStack_768._0_8_;
    auStack_7f8._56_8_ = auStack_7f8._56_8_ + auStack_768._8_8_;
    auStack_7f8._64_8_ = auStack_7f8._64_8_ + auStack_768._16_8_;
    auStack_7f8._72_8_ = auStack_7f8._72_8_ + auStack_768._24_8_;
    auStack_7f8._80_8_ = auStack_7f8._80_8_ + auStack_768._32_8_;
    auStack_7f8._92_4_ = 0;
    auStack_7f8._88_4_ = auStack_768._40_4_ + auStack_7f8._88_4_;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7f8 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7f8 + 0x60));
    uVar187 = (uStack_778 >> 0x30) * 0x1000003d1 + auStack_7f8._96_8_;
    if (((uVar187 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar187 & 0xfffffffffffff) == 0)) {
      uVar198 = (uVar187 >> 0x34) + uStack_790;
      uVar199 = (uVar198 >> 0x34) + uStack_788;
      uVar196 = (uVar199 >> 0x34) + uStack_780;
      uVar200 = (uVar196 >> 0x34) + (uStack_778 & 0xffffffffffff);
      if ((((uVar198 | uVar187 | uVar199 | uVar196) & 0xfffffffffffff) == 0 && uVar200 == 0) ||
         ((uVar187 + 0x1000003d0 & uVar198 & uVar199 & uVar196 & (uVar200 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        secp256k1_fe_verify((secp256k1_fe *)(auStack_7f8 + 0x30));
        uVar187 = ((ulong)auStack_7f8._80_8_ >> 0x30) * 0x1000003d1 + auStack_7f8._48_8_;
        if (((uVar187 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar187 & 0xfffffffffffff) == 0))
        {
          uVar198 = (uVar187 >> 0x34) + auStack_7f8._56_8_;
          p_Var191 = (_func_void_char_ptr_void_ptr *)(auStack_7f8._64_8_ + (uVar198 >> 0x34));
          uVar199 = ((ulong)p_Var191 >> 0x34) + auStack_7f8._72_8_;
          uVar196 = (uVar199 >> 0x34) + (auStack_7f8._80_8_ & 0xffffffffffff);
          if ((((uVar198 | uVar187 | (ulong)p_Var191 | uVar199) & 0xfffffffffffff) == 0 &&
               uVar196 == 0) ||
             ((uVar187 + 0x1000003d0 & uVar198 & (ulong)p_Var191 & uVar199 &
              (uVar196 ^ 0xf000000000000)) == 0xfffffffffffff)) {
            secp256k1_gej_double_var
                      ((secp256k1_gej *)psVar192,(secp256k1_gej *)a_04,(secp256k1_fe *)0x0);
            return;
          }
        }
        secp256k1_gej_set_infinity((secp256k1_gej *)psVar192);
        return;
      }
    }
    (psVar192->ecmult_gen_ctx).initial.z.magnitude = 0;
    psVar182 = (secp256k1_context *)(auStack_7f8 + 0x60);
    secp256k1_fe_mul((secp256k1_fe *)&(psVar192->ecmult_gen_ctx).initial.y.magnitude,
                     (secp256k1_fe *)piVar202,(secp256k1_fe *)psVar182);
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    if (8 < (int)uStack_770) goto LAB_00122712;
    psVar182 = (secp256k1_context *)(auStack_638 + 0x30);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auStack_7f8._96_8_ * 2;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uStack_780;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uStack_790 * 2;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uStack_788;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uStack_778;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uStack_778;
    uVar198 = SUB168(auVar44 * auVar116,0);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar198 & 0xfffffffffffff;
    auVar22 = auVar43 * auVar115 + auVar42 * auVar114 + auVar45 * ZEXT816(0x1000003d10);
    uVar187 = auVar22._0_8_;
    auStack_7f8._0_8_ = uVar187 & 0xfffffffffffff;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar187 >> 0x34 | auVar22._8_8_ << 0xc;
    uVar187 = uStack_778 * 2;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = auStack_7f8._96_8_;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uVar187;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uStack_790 * 2;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uStack_780;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uStack_788;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uStack_788;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar198 >> 0x34 | SUB168(auVar44 * auVar116,8) << 0xc;
    auVar22 = auVar46 * auVar117 + auVar160 + auVar47 * auVar118 + auVar48 * auVar119 +
              auVar49 * ZEXT816(0x1000003d10);
    uVar198 = auVar22._0_8_;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar198 >> 0x34 | auVar22._8_8_ << 0xc;
    auStack_708._48_8_ = uVar198 & 0xffffffffffff;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = auStack_7f8._96_8_;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = auStack_7f8._96_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uStack_790;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar187;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uStack_788 * 2;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uStack_780;
    auVar22 = auVar51 * auVar121 + auVar161 + auVar52 * auVar122;
    uVar199 = auVar22._0_8_;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar199 >> 0x34 | auVar22._8_8_ << 0xc;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = (uVar199 & 0xfffffffffffff) << 4 | (uVar198 & 0xfffffffffffff) >> 0x30;
    auVar22 = auVar50 * auVar120 + ZEXT816(0x1000003d1) * auVar123;
    uVar198 = auVar22._0_8_;
    auStack_638._48_8_ = uVar198 & 0xfffffffffffff;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar198 >> 0x34 | auVar22._8_8_ << 0xc;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = auStack_7f8._96_8_ * 2;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uStack_790;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uStack_788;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = uVar187;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uStack_780;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uStack_780;
    auVar23 = auVar54 * auVar125 + auVar163 + auVar55 * auVar126;
    uVar198 = auVar23._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar198 & 0xfffffffffffff;
    auVar22 = auVar53 * auVar124 + auVar162 + auVar56 * ZEXT816(0x1000003d10);
    uVar199 = auVar22._0_8_;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar198 >> 0x34 | auVar23._8_8_ << 0xc;
    uStack_600 = uVar199 & 0xfffffffffffff;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar199 >> 0x34 | auVar22._8_8_ << 0xc;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = auStack_7f8._96_8_ * 2;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uStack_788;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uStack_790;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uStack_790;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uStack_780;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar187;
    auVar165 = auVar59 * auVar129 + auVar165;
    uVar187 = auVar165._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar187 & 0xfffffffffffff;
    auVar22 = auVar57 * auVar127 + auVar164 + auVar58 * auVar128 + auVar60 * ZEXT816(0x1000003d10);
    uVar198 = auVar22._0_8_;
    p_Stack_5f8 = (_func_void_char_ptr_void_ptr *)(uVar198 & 0xfffffffffffff);
    auVar166._8_8_ = 0;
    auVar166._0_8_ = (uVar198 >> 0x34 | auVar22._8_8_ << 0xc) + auStack_7f8._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar187 >> 0x34 | auVar165._8_8_ << 0xc;
    auVar166 = auVar61 * ZEXT816(0x1000003d10) + auVar166;
    uVar187 = auVar166._0_8_;
    pvStack_5f0 = (void *)(uVar187 & 0xfffffffffffff);
    p_Stack_5e8 = (_func_void_char_ptr_void_ptr *)
                  ((uVar187 >> 0x34 | auVar166._8_8_ << 0xc) + auStack_708._48_8_);
    pvStack_5e0 = (void *)0x1;
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    if (1 < (int)pvStack_5e0) goto LAB_00122717;
    psVar193 = (secp256k1_fe *)(auStack_638 + 0x30);
    auStack_638._48_8_ = 0x3ffffbfffff0bc - auStack_638._48_8_;
    uStack_600 = 0x3ffffffffffffc - uStack_600;
    p_Stack_5f8 = (_func_void_char_ptr_void_ptr *)(0x3ffffffffffffc - (long)p_Stack_5f8);
    pvStack_5f0 = (void *)(0x3ffffffffffffc - (long)pvStack_5f0);
    p_Stack_5e8 = (_func_void_char_ptr_void_ptr *)(0x3fffffffffffc - (long)p_Stack_5e8);
    pvStack_5e0 = (void *)0x2;
    secp256k1_fe_verify(psVar193);
    secp256k1_fe_mul((secp256k1_fe *)auStack_7f8,psVar193,(secp256k1_fe *)(auStack_7f8 + 0x60));
    secp256k1_fe_mul((secp256k1_fe *)(auStack_708 + 0x30),(secp256k1_fe *)auStack_708,psVar193);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7f8 + 0x30));
    psVar182 = psVar192;
    if (8 < (int)auStack_7f8._88_4_) goto LAB_0012271c;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = auStack_7f8._48_8_ * 2;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = auStack_7f8._72_8_;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = auStack_7f8._56_8_ * 2;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = auStack_7f8._64_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = auStack_7f8._80_8_;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auStack_7f8._80_8_;
    uVar198 = SUB168(auVar64 * auVar132,0);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar198 & 0xfffffffffffff;
    auVar22 = auVar63 * auVar131 + auVar62 * auVar130 + auVar65 * ZEXT816(0x1000003d10);
    uVar199 = auVar22._0_8_;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar199 >> 0x34 | auVar22._8_8_ << 0xc;
    uVar187 = auStack_7f8._80_8_ * 2;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = auStack_7f8._48_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar187;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = auStack_7f8._56_8_ * 2;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = auStack_7f8._72_8_;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auStack_7f8._64_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = auStack_7f8._64_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar198 >> 0x34 | SUB168(auVar64 * auVar132,8) << 0xc;
    auVar22 = auVar66 * auVar133 + auVar167 + auVar67 * auVar134 + auVar68 * auVar135 +
              auVar69 * ZEXT816(0x1000003d10);
    uStack_6a0 = auVar22._0_8_;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uStack_6a0 >> 0x34 | auVar22._8_8_ << 0xc;
    uStack_6a8 = (uStack_6a0 & 0xfffffffffffff) >> 0x30;
    uStack_6a0 = uStack_6a0 & 0xffffffffffff;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = auStack_7f8._48_8_;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auStack_7f8._48_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auStack_7f8._56_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = uVar187;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auStack_7f8._64_8_ * 2;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = auStack_7f8._72_8_;
    auVar22 = auVar71 * auVar137 + auVar168 + auVar72 * auVar138;
    uVar198 = auVar22._0_8_;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar198 >> 0x34 | auVar22._8_8_ << 0xc;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = (uVar198 & 0xfffffffffffff) << 4 | uStack_6a8;
    auVar22 = auVar70 * auVar136 + ZEXT816(0x1000003d1) * auVar139;
    uVar196 = auVar22._0_8_;
    uVar198 = uVar196 & 0xfffffffffffff;
    (psVar192->ecmult_gen_ctx).built = (int)uVar198;
    (psVar192->ecmult_gen_ctx).blind = (int)(uVar198 >> 0x20);
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar196 >> 0x34 | auVar22._8_8_ << 0xc;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auStack_7f8._48_8_ * 2;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = auStack_7f8._56_8_;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = auStack_7f8._64_8_;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uVar187;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auStack_7f8._72_8_;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = auStack_7f8._72_8_;
    auVar23 = auVar74 * auVar141 + auVar170 + auVar75 * auVar142;
    uVar198 = auVar23._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar198 & 0xfffffffffffff;
    auVar22 = auVar73 * auVar140 + auVar169 + auVar76 * ZEXT816(0x1000003d10);
    uVar196 = auVar22._0_8_;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar198 >> 0x34 | auVar23._8_8_ << 0xc;
    (psVar192->ecmult_gen_ctx).initial.x.n[0] = uVar196 & 0xfffffffffffff;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar196 >> 0x34 | auVar22._8_8_ << 0xc;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = auStack_7f8._48_8_ * 2;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = auStack_7f8._64_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = auStack_7f8._56_8_;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = auStack_7f8._56_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = auStack_7f8._72_8_;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uVar187;
    auVar172 = auVar79 * auVar145 + auVar172;
    uVar187 = auVar172._0_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar187 & 0xfffffffffffff;
    auVar22 = auVar77 * auVar143 + auVar171 + auVar78 * auVar144 + auVar80 * ZEXT816(0x1000003d10);
    uVar198 = auVar22._0_8_;
    (psVar192->ecmult_gen_ctx).initial.x.n[1] = uVar198 & 0xfffffffffffff;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = (uVar198 >> 0x34 | auVar22._8_8_ << 0xc) + (uVar199 & 0xfffffffffffff);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar187 >> 0x34 | auVar172._8_8_ << 0xc;
    auVar173 = auVar81 * ZEXT816(0x1000003d10) + auVar173;
    uVar187 = auVar173._0_8_;
    (psVar192->ecmult_gen_ctx).initial.x.n[2] = uVar187 & 0xfffffffffffff;
    (psVar192->ecmult_gen_ctx).initial.x.n[3] =
         (uVar187 >> 0x34 | auVar173._8_8_ << 0xc) + uStack_6a0;
    (psVar192->ecmult_gen_ctx).initial.x.n[4] = 1;
    secp256k1_fe_verify((secp256k1_fe *)psVar192);
    secp256k1_fe_verify((secp256k1_fe *)psVar192);
    psVar182 = (secp256k1_context *)auStack_7f8;
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    iVar176 = auStack_7f8._40_4_ + (int)(psVar192->ecmult_gen_ctx).initial.x.n[4];
    if (0x20 < iVar176) goto LAB_00122721;
    uVar1 = (psVar192->ecmult_gen_ctx).initial.x.n[0];
    uVar174 = (psVar192->ecmult_gen_ctx).initial.x.n[1];
    uVar175 = (psVar192->ecmult_gen_ctx).initial.x.n[2];
    *(long *)&psVar192->ecmult_gen_ctx = *(long *)&psVar192->ecmult_gen_ctx + auStack_7f8._0_8_;
    (psVar192->ecmult_gen_ctx).initial.x.n[0] = uVar1 + auStack_7f8._8_8_;
    (psVar192->ecmult_gen_ctx).initial.x.n[1] = uVar174 + auStack_7f8._16_8_;
    (psVar192->ecmult_gen_ctx).initial.x.n[2] = uVar175 + auStack_7f8._24_8_;
    puVar195 = (psVar192->ecmult_gen_ctx).initial.x.n + 3;
    *puVar195 = *puVar195 + auStack_7f8._32_8_;
    *(int *)((psVar192->ecmult_gen_ctx).initial.x.n + 4) = iVar176;
    *(undefined4 *)((long)(psVar192->ecmult_gen_ctx).initial.x.n + 0x24) = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar192);
    secp256k1_fe_verify((secp256k1_fe *)psVar192);
    psVar182 = (secp256k1_context *)(auStack_708 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    iVar176 = iStack_6b0 + (int)(psVar192->ecmult_gen_ctx).initial.x.n[4];
    if (0x20 < iVar176) goto LAB_00122726;
    uVar1 = (psVar192->ecmult_gen_ctx).initial.x.n[0];
    uVar174 = (psVar192->ecmult_gen_ctx).initial.x.n[1];
    uVar175 = (psVar192->ecmult_gen_ctx).initial.x.n[2];
    psVar182 = (secp256k1_context *)(auStack_708 + 0x30);
    *(long *)&psVar192->ecmult_gen_ctx = *(long *)&psVar192->ecmult_gen_ctx + auStack_708._48_8_;
    (psVar192->ecmult_gen_ctx).initial.x.n[0] = uVar1 + uStack_6d0;
    (psVar192->ecmult_gen_ctx).initial.x.n[1] = (uint64_t)(p_Stack_6c8 + uVar174);
    (psVar192->ecmult_gen_ctx).initial.x.n[2] = uVar175 + (long)pvStack_6c0;
    puVar195 = (psVar192->ecmult_gen_ctx).initial.x.n + 3;
    *puVar195 = (uint64_t)(p_Stack_6b8 + *puVar195);
    *(int *)((psVar192->ecmult_gen_ctx).initial.x.n + 4) = iVar176;
    *(undefined4 *)((long)(psVar192->ecmult_gen_ctx).initial.x.n + 0x24) = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar192);
    secp256k1_fe_verify((secp256k1_fe *)psVar192);
    secp256k1_fe_verify((secp256k1_fe *)psVar182);
    iVar176 = iStack_6b0 + (int)(psVar192->ecmult_gen_ctx).initial.x.n[4];
    if (0x20 < iVar176) goto LAB_0012272b;
    uVar1 = (psVar192->ecmult_gen_ctx).initial.x.n[0];
    uVar174 = (psVar192->ecmult_gen_ctx).initial.x.n[1];
    uVar175 = (psVar192->ecmult_gen_ctx).initial.x.n[2];
    *(long *)&psVar192->ecmult_gen_ctx = *(long *)&psVar192->ecmult_gen_ctx + auStack_708._48_8_;
    (psVar192->ecmult_gen_ctx).initial.x.n[0] = uVar1 + uStack_6d0;
    (psVar192->ecmult_gen_ctx).initial.x.n[1] = (uint64_t)(p_Stack_6c8 + uVar174);
    (psVar192->ecmult_gen_ctx).initial.x.n[2] = uVar175 + (long)pvStack_6c0;
    puVar195 = (psVar192->ecmult_gen_ctx).initial.x.n + 3;
    *puVar195 = (uint64_t)(p_Stack_6b8 + *puVar195);
    *(int *)((psVar192->ecmult_gen_ctx).initial.x.n + 4) = iVar176;
    *(undefined4 *)((long)(psVar192->ecmult_gen_ctx).initial.x.n + 0x24) = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar192);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_708 + 0x30));
    psVar182 = psVar192;
    secp256k1_fe_verify((secp256k1_fe *)psVar192);
    iVar176 = (int)(psVar192->ecmult_gen_ctx).initial.x.n[4] + iStack_6b0;
    if (iVar176 < 0x21) {
      auStack_708._48_8_ = *(long *)&psVar192->ecmult_gen_ctx + auStack_708._48_8_;
      uStack_6d0 = (psVar192->ecmult_gen_ctx).initial.x.n[0] + uStack_6d0;
      p_Stack_6c8 = p_Stack_6c8 + (psVar192->ecmult_gen_ctx).initial.x.n[1];
      pvStack_6c0 = (void *)((psVar192->ecmult_gen_ctx).initial.x.n[2] + (long)pvStack_6c0);
      p_Stack_6b8 = p_Stack_6b8 + (psVar192->ecmult_gen_ctx).initial.x.n[3];
      uStack_6ac = 0;
      iStack_6b0 = iVar176;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_708 + 0x30));
      piVar202 = &(psVar192->ecmult_gen_ctx).initial.x.magnitude;
      secp256k1_fe_mul((secp256k1_fe *)piVar202,(secp256k1_fe *)(auStack_708 + 0x30),
                       (secp256k1_fe *)(auStack_7f8 + 0x30));
      psVar182 = (secp256k1_context *)auStack_7f8;
      secp256k1_fe_mul((secp256k1_fe *)psVar182,(secp256k1_fe *)psVar182,(secp256k1_fe *)auStack_768
                      );
      secp256k1_fe_verify((secp256k1_fe *)piVar202);
      secp256k1_fe_verify((secp256k1_fe *)psVar182);
      iVar176 = auStack_7f8._40_4_ + (int)(psVar192->ecmult_gen_ctx).initial.y.n[4];
      if (iVar176 < 0x21) {
        uVar1 = (psVar192->ecmult_gen_ctx).initial.y.n[0];
        uVar174 = (psVar192->ecmult_gen_ctx).initial.y.n[1];
        uVar175 = (psVar192->ecmult_gen_ctx).initial.y.n[2];
        *(long *)&(psVar192->ecmult_gen_ctx).initial.x.magnitude =
             *(long *)&(psVar192->ecmult_gen_ctx).initial.x.magnitude + auStack_7f8._0_8_;
        (psVar192->ecmult_gen_ctx).initial.y.n[0] = uVar1 + auStack_7f8._8_8_;
        (psVar192->ecmult_gen_ctx).initial.y.n[1] = uVar174 + auStack_7f8._16_8_;
        (psVar192->ecmult_gen_ctx).initial.y.n[2] = uVar175 + auStack_7f8._24_8_;
        puVar195 = (psVar192->ecmult_gen_ctx).initial.y.n + 3;
        *puVar195 = *puVar195 + auStack_7f8._32_8_;
        *(int *)((psVar192->ecmult_gen_ctx).initial.y.n + 4) = iVar176;
        *(undefined4 *)((long)(psVar192->ecmult_gen_ctx).initial.y.n + 0x24) = 0;
        secp256k1_fe_verify((secp256k1_fe *)piVar202);
        secp256k1_gej_verify((secp256k1_gej *)psVar192);
        return;
      }
      goto LAB_00122735;
    }
  }
  else {
    (psVar192->ecmult_gen_ctx).initial.z.magnitude = a_03->infinity;
    psVar182 = z;
    secp256k1_fe_verify((secp256k1_fe *)z);
    if ((int)(z->ecmult_gen_ctx).initial.x.n[4] < 9) {
      uVar187 = *(ulong *)&z->ecmult_gen_ctx;
      uVar198 = (z->ecmult_gen_ctx).initial.x.n[0];
      uVar199 = (z->ecmult_gen_ctx).initial.x.n[1];
      uVar196 = (z->ecmult_gen_ctx).initial.x.n[2];
      uVar200 = (z->ecmult_gen_ctx).initial.x.n[3];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar187 * 2;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar196;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar198 * 2;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar199;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar200;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar200;
      uVar179 = SUB168(auVar4 * auVar84,0);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar179 & 0xfffffffffffff;
      auVar22 = auVar3 * auVar83 + auVar2 * auVar82 + auVar5 * ZEXT816(0x1000003d10);
      uVar186 = auVar22._0_8_;
      sStack_668.n[0] = uVar186 & 0xfffffffffffff;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = uVar186 >> 0x34 | auVar22._8_8_ << 0xc;
      uVar200 = uVar200 * 2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar187;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = uVar200;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar198 * 2;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar196;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar199;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar199;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar179 >> 0x34 | SUB168(auVar4 * auVar84,8) << 0xc;
      auVar22 = auVar6 * auVar85 + auVar146 + auVar7 * auVar86 + auVar8 * auVar87 +
                auVar9 * ZEXT816(0x1000003d10);
      uVar179 = auVar22._0_8_;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = uVar179 >> 0x34 | auVar22._8_8_ << 0xc;
      auStack_768._48_8_ = (uVar179 & 0xfffffffffffff) >> 0x30;
      auStack_708._0_8_ = uVar179 & 0xffffffffffff;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar187;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar187;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar198;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar200;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar199 * 2;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar196;
      auVar22 = auVar11 * auVar89 + auVar147 + auVar12 * auVar90;
      uVar179 = auVar22._0_8_;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar179 >> 0x34 | auVar22._8_8_ << 0xc;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = (uVar179 & 0xfffffffffffff) << 4 | auStack_768._48_8_;
      auVar22 = auVar10 * auVar88 + ZEXT816(0x1000003d1) * auVar91;
      uVar179 = auVar22._0_8_;
      auStack_638._0_8_ = uVar179 & 0xfffffffffffff;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar179 >> 0x34 | auVar22._8_8_ << 0xc;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar187 * 2;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar198;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar199;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar200;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar196;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar196;
      auVar23 = auVar14 * auVar93 + auVar149 + auVar15 * auVar94;
      uVar179 = auVar23._0_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar179 & 0xfffffffffffff;
      auVar22 = auVar13 * auVar92 + auVar148 + auVar16 * ZEXT816(0x1000003d10);
      uVar186 = auVar22._0_8_;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = uVar179 >> 0x34 | auVar23._8_8_ << 0xc;
      auStack_638._8_8_ = uVar186 & 0xfffffffffffff;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar186 >> 0x34 | auVar22._8_8_ << 0xc;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar187 * 2;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar199;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar198;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar198;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar196;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = uVar200;
      auVar151 = auVar19 * auVar97 + auVar151;
      uVar187 = auVar151._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar187 & 0xfffffffffffff;
      auVar22 = auVar17 * auVar95 + auVar150 + auVar18 * auVar96 + auVar20 * ZEXT816(0x1000003d10);
      uVar198 = auVar22._0_8_;
      auStack_638._16_8_ = uVar198 & 0xfffffffffffff;
      auVar152._8_8_ = 0;
      auVar152._0_8_ =
           (_func_void_char_ptr_void_ptr *)
           (sStack_668.n[0] + (uVar198 >> 0x34 | auVar22._8_8_ << 0xc));
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar187 >> 0x34 | auVar151._8_8_ << 0xc;
      auVar152 = auVar21 * ZEXT816(0x1000003d10) + auVar152;
      uVar187 = auVar152._0_8_;
      auStack_638._24_8_ = uVar187 & 0xfffffffffffff;
      auStack_638._32_8_ = (uVar187 >> 0x34 | auVar152._8_8_ << 0xc) + auStack_708._0_8_;
      auStack_638._40_8_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)auStack_638);
      secp256k1_fe_mul(&sStack_668,(secp256k1_fe *)auStack_638,(secp256k1_fe *)z);
      secp256k1_fe_mul((secp256k1_fe *)psVar192,&a_03->x,(secp256k1_fe *)auStack_638);
      secp256k1_fe_mul((secp256k1_fe *)&(psVar192->ecmult_gen_ctx).initial.x.magnitude,&a_03->y,
                       &sStack_668);
      (psVar192->ecmult_gen_ctx).initial.y.magnitude = 1;
      (psVar192->ecmult_gen_ctx).initial.y.normalized = 0;
      (psVar192->ecmult_gen_ctx).initial.z.n[0] = 0;
      (psVar192->ecmult_gen_ctx).initial.z.n[1] = 0;
      psVar197 = &(psVar192->ecmult_gen_ctx).initial;
      (psVar197->z).n[2] = 0;
      (psVar197->z).n[3] = 0;
      (psVar192->ecmult_gen_ctx).initial.z.n[4] = 0x100000001;
      secp256k1_fe_verify((secp256k1_fe *)&(psVar192->ecmult_gen_ctx).initial.y.magnitude);
      return;
    }
    secp256k1_gej_add_zinv_var_cold_1();
LAB_001226f9:
    secp256k1_gej_add_zinv_var_cold_14();
LAB_001226fe:
    secp256k1_gej_add_zinv_var_cold_13();
LAB_00122703:
    secp256k1_gej_add_zinv_var_cold_12();
LAB_00122708:
    secp256k1_gej_add_zinv_var_cold_11();
LAB_0012270d:
    secp256k1_gej_add_zinv_var_cold_10();
LAB_00122712:
    secp256k1_gej_add_zinv_var_cold_9();
LAB_00122717:
    secp256k1_gej_add_zinv_var_cold_8();
LAB_0012271c:
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00122721:
    secp256k1_gej_add_zinv_var_cold_6();
LAB_00122726:
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0012272b:
    secp256k1_gej_add_zinv_var_cold_4();
  }
  secp256k1_gej_add_zinv_var_cold_3();
LAB_00122735:
  secp256k1_gej_add_zinv_var_cold_2();
  (psVar182->ecmult_gen_ctx).initial.y.magnitude = 1;
  (psVar182->ecmult_gen_ctx).initial.x.n[4] = 0x100000000;
  (psVar182->ecmult_gen_ctx).built = 0;
  (psVar182->ecmult_gen_ctx).blind = 0;
  (psVar182->ecmult_gen_ctx).initial.x.n[0] = 0;
  (psVar182->ecmult_gen_ctx).initial.x.n[1] = 0;
  (psVar182->ecmult_gen_ctx).initial.x.n[2] = 0;
  (psVar182->ecmult_gen_ctx).initial.x.n[3] = 0;
  secp256k1_fe_verify((secp256k1_fe *)psVar182);
  (psVar182->ecmult_gen_ctx).initial.y.n[4] = 0x100000000;
  (psVar182->ecmult_gen_ctx).initial.x.magnitude = 0;
  (psVar182->ecmult_gen_ctx).initial.x.normalized = 0;
  (psVar182->ecmult_gen_ctx).initial.y.n[0] = 0;
  (psVar182->ecmult_gen_ctx).initial.y.n[1] = 0;
  (psVar182->ecmult_gen_ctx).initial.y.n[2] = 0;
  (psVar182->ecmult_gen_ctx).initial.y.n[3] = 0;
  secp256k1_fe_verify((secp256k1_fe *)&(psVar182->ecmult_gen_ctx).initial.x.magnitude);
  secp256k1_ge_verify((secp256k1_ge *)psVar182);
  return;
}

Assistant:

static SECP256K1_INLINE void heap_down(unsigned char *a, size_t i, size_t heap_size, size_t stride,
                            int (*cmp)(const void *, const void *, void *), void *cmp_data) {
    while (i < heap_size/2) {
        VERIFY_CHECK(i <= SIZE_MAX/2 - 1);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size <= SIZE_MAX
         * 2*i <= SIZE_MAX - 2
         */

        VERIFY_CHECK(child1(i) < heap_size);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size
         * 2*i + 1 < heap_size
         * child1(i) < heap_size
         */

        /* Let [x] be notation for the contents at a[x*stride].
         *
         * If [child1(i)] > [i] and [child2(i)] > [i],
         *   swap [i] with the larger child to ensure the new parent is larger
         *   than both children. When [child1(i)] == [child2(i)], swap [i] with
         *   [child2(i)].
         * Else if [child1(i)] > [i], swap [i] with [child1(i)].
         * Else if [child2(i)] > [i], swap [i] with [child2(i)].
         */
        if (child2(i) < heap_size
                && 0 <= cmp(a + child2(i)*stride, a + child1(i)*stride, cmp_data)) {
            if (0 < cmp(a + child2(i)*stride, a +         i*stride, cmp_data)) {
                heap_swap(a, i, child2(i), stride);
                i = child2(i);
            } else {
                /* At this point we have [child2(i)] >= [child1(i)] and we have
                 * [child2(i)] <= [i], and thus [child1(i)] <= [i] which means
                 * that the next comparison can be skipped. */
                return;
            }
        } else if (0 < cmp(a + child1(i)*stride, a +         i*stride, cmp_data)) {
            heap_swap(a, i, child1(i), stride);
            i = child1(i);
        } else {
            return;
        }
    }
    /* heap_size/2 <= i
     * heap_size/2 < i + 1
     * heap_size < 2*i + 2
     * heap_size <= 2*i + 1
     * heap_size <= child1(i)
     * Thus child1(i) and child2(i) are now out of bounds and we are at a leaf.
     */
}